

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::operator/=(path *this,path *p)

{
  char cVar1;
  size_type sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  pointer pcVar8;
  char cVar9;
  iterator iter;
  const_iterator local_108;
  const_iterator local_100;
  undefined1 local_f8 [32];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [32];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  impl_string_type local_78;
  const_iterator local_58;
  path local_50;
  
  cVar9 = (char)this;
  if ((p->_path)._M_string_length == 0) {
    sVar2 = (this->_path)._M_string_length;
    if (sVar2 == 0) {
      return this;
    }
    cVar1 = (this->_path)._M_dataplus._M_p[sVar2 - 1];
    if (cVar1 == '/') {
      return this;
    }
    if (cVar1 == ':') {
      return this;
    }
    std::__cxx11::string::push_back(cVar9);
    return this;
  }
  bVar5 = has_root_directory(p);
  if (bVar5) {
    pcVar8 = (this->_path)._M_dataplus._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_78,pcVar8,pcVar8 + (this->_path)._M_string_length);
    postprocess_path_with_format(&local_78,(format)pcVar8);
    root_name(&local_50,this);
    bVar6 = true;
    if ((local_78._M_string_length == local_50._path._M_string_length) &&
       (((local_78._M_string_length == 0 ||
         (iVar7 = bcmp(local_78._M_dataplus._M_p,local_50._path._M_dataplus._M_p,
                       local_78._M_string_length), iVar7 == 0)) &&
        (iVar7 = std::__cxx11::string::compare((char *)p), iVar7 == 0)))) goto LAB_00151d70;
LAB_00151e4f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._path._M_dataplus._M_p != &local_50._path.field_2) {
      operator_delete(local_50._path._M_dataplus._M_p,
                      local_50._path.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else {
LAB_00151d70:
    bVar6 = has_root_name(p);
    if (!bVar6) {
      if (!bVar5) goto LAB_00151ea6;
      bVar6 = false;
      goto LAB_00151e4f;
    }
    root_name((path *)local_b8,p);
    root_name((path *)local_f8,this);
    if (local_b8._8_8_ == local_f8._8_8_) {
      if ((char *)local_b8._8_8_ == (char *)0x0) {
        bVar6 = false;
      }
      else {
        iVar7 = bcmp((void *)local_b8._0_8_,(void *)local_f8._0_8_,local_b8._8_8_);
        bVar6 = iVar7 != 0;
      }
    }
    else {
      bVar6 = true;
    }
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    if (bVar5) goto LAB_00151e4f;
  }
  if (bVar6) {
    std::__cxx11::string::_M_assign((string *)this);
    return this;
  }
LAB_00151ea6:
  bVar5 = has_root_directory(p);
  if (bVar5) {
    root_name((path *)local_b8,this);
    std::__cxx11::string::_M_assign((string *)this);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
  }
  else {
    bVar5 = has_root_directory(this);
    if (((!bVar5) && (bVar5 = has_root_directory(this), bVar5)) ||
       (bVar5 = has_filename(this), bVar5)) {
      std::__cxx11::string::push_back(cVar9);
    }
  }
  local_108._M_current = (p->_path)._M_dataplus._M_p;
  local_100._M_current = local_108._M_current + (p->_path)._M_string_length;
  local_f8._0_8_ = local_108._M_current;
  iterator::iterator((iterator *)local_b8,(const_iterator *)local_f8,&local_100,&local_108);
  bVar5 = has_root_name(p);
  if (bVar5) {
    iterator::operator++((iterator *)local_b8);
  }
  bVar5 = true;
  while( true ) {
    local_100._M_current = (p->_path)._M_dataplus._M_p;
    local_108._M_current = local_100._M_current + (p->_path)._M_string_length;
    local_58._M_current = local_108._M_current;
    iterator::iterator((iterator *)local_f8,&local_100,&local_108,&local_58);
    uVar4 = local_b8._24_8_;
    uVar3 = local_f8._24_8_;
    iVar7 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
      iVar7 = extraout_EDX_00;
    }
    if (uVar4 == uVar3) break;
    if ((!bVar5) &&
       ((sVar2 = (this->_path)._M_string_length, sVar2 == 0 ||
        ((this->_path)._M_dataplus._M_p[sVar2 - 1] != '/')))) {
      std::__cxx11::string::push_back(cVar9);
      iVar7 = extraout_EDX_01;
    }
    iterator::operator++((iterator *)local_f8,(iterator *)local_b8,iVar7);
    std::__cxx11::string::_M_append((char *)this,(ulong)local_d8._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

GHC_INLINE path& path::operator/=(const path& p)
{
    if (p.empty()) {
        // was: if ((!has_root_directory() && is_absolute()) || has_filename())
        if (!_path.empty() && _path[_path.length() - 1] != '/' && _path[_path.length() - 1] != ':') {
            _path += '/';
        }
        return *this;
    }
    if ((p.is_absolute() && (_path != root_name() || p._path != "/")) || (p.has_root_name() && p.root_name() != root_name())) {
        assign(p);
        return *this;
    }
    if (p.has_root_directory()) {
        assign(root_name());
    }
    else if ((!has_root_directory() && is_absolute()) || has_filename()) {
        _path += '/';
    }
    auto iter = p.begin();
    bool first = true;
    if (p.has_root_name()) {
        ++iter;
    }
    while (iter != p.end()) {
        if (!first && !(!_path.empty() && _path[_path.length() - 1] == '/')) {
            _path += '/';
        }
        first = false;
        _path += (*iter++).generic_string();
    }
    return *this;
}